

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateDataPhysBCFunct::operator()
          (StateDataPhysBCFunct *this,MultiFab *mf,int dest_comp,int num_comp,IntVect *param_5,
          Real time,int param_7)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Box *pBVar7;
  BaseFab<double> *this_00;
  byte bVar8;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  Box db_1;
  int ishift_1;
  Array4<double> *tmpa_1;
  Elixir elitmp_1;
  Box db;
  int ishift;
  Array4<double> *tmpa;
  Elixir elitmp;
  Box hi_slab;
  Box lo_slab;
  int dir_2;
  int hi;
  int lo;
  int dir_1;
  Box GrownDomain;
  bool touch;
  int i;
  bool is_periodic;
  bool has_phys_bc;
  Box *bx_1;
  Array4<double> *desta;
  FArrayBox *dest;
  MFIter mfi;
  FArrayBox tmp;
  bool run_on_gpu;
  bool has_bndryfunc_fab;
  RealBox *prob_domain;
  Real *dx;
  int *domainhi;
  int *domainlo;
  Box bx;
  Box *domain_mt;
  int off;
  uint bitval;
  uint typ;
  int dir;
  undefined4 in_stack_fffffffffffff668;
  int in_stack_fffffffffffff66c;
  undefined4 in_stack_fffffffffffff670;
  int in_stack_fffffffffffff674;
  Box *in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff680;
  int in_stack_fffffffffffff684;
  undefined4 in_stack_fffffffffffff694;
  uchar flags_;
  int in_stack_fffffffffffff698;
  byte in_stack_fffffffffffff69c;
  byte in_stack_fffffffffffff69d;
  undefined1 in_stack_fffffffffffff69e;
  undefined1 uVar9;
  MFIter *in_stack_fffffffffffff6a0;
  Box local_93c;
  int local_920;
  int local_91c;
  undefined4 local_918;
  undefined1 auStack_910 [64];
  undefined4 local_8d0;
  undefined1 auStack_8c8 [64];
  int local_888;
  int local_884;
  undefined4 local_880;
  undefined1 auStack_878 [64];
  undefined1 auStack_838 [8];
  int in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  Geometry *in_stack_fffffffffffff7d8;
  Real in_stack_fffffffffffff7e0;
  FArrayBox *in_stack_fffffffffffff7e8;
  Box *in_stack_fffffffffffff7f0;
  StateData *in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  int in_stack_fffffffffffff814;
  Box *in_stack_fffffffffffff818;
  BaseFab<double> *in_stack_fffffffffffff820;
  BaseFab<double> *in_stack_fffffffffffff828;
  int in_stack_fffffffffffff848;
  int in_stack_fffffffffffff84c;
  RealBox *in_stack_fffffffffffff850;
  Real *in_stack_fffffffffffff858;
  Real in_stack_fffffffffffff860;
  FArrayBox *in_stack_fffffffffffff868;
  StateData *in_stack_fffffffffffff870;
  Box local_784;
  int local_768;
  int local_764;
  undefined4 local_760;
  undefined1 auStack_758 [64];
  undefined4 local_718;
  undefined1 auStack_710 [64];
  int local_6d0;
  int local_6cc;
  undefined4 local_6c8;
  undefined1 auStack_6c0 [64];
  undefined1 auStack_680 [64];
  undefined4 local_640;
  int local_634;
  Array4<double> local_630;
  Array4<double> *local_5f0;
  int local_5d0 [4];
  undefined8 in_stack_fffffffffffffa40;
  int local_5b4 [4];
  int local_5a4;
  int local_598;
  int local_58c;
  Box local_588;
  byte local_569;
  int local_568;
  byte local_562;
  byte local_561;
  Box *local_560;
  undefined1 local_558 [40];
  int in_stack_fffffffffffffad0;
  MFIter local_4f8;
  undefined1 local_498 [24];
  undefined1 auStack_480 [12];
  int iStack_474;
  int local_470;
  int iStack_46c;
  int local_464;
  byte local_44a;
  byte local_449;
  RealBox *local_448;
  Real *local_440;
  int *local_438;
  int *local_430;
  uint local_428;
  undefined1 local_424 [28];
  Box *local_408;
  undefined4 local_3e8;
  undefined4 local_3e4;
  uint local_3cc;
  uint *local_3c8;
  Box *local_3c0;
  int local_3b8;
  uint local_3b4;
  uint local_3b0;
  int local_3ac;
  undefined1 *local_3a8;
  uint local_39c;
  Box *local_398;
  undefined1 *local_390;
  BaseFab<double> *local_388;
  int local_380;
  int local_37c;
  int *local_378;
  int local_370;
  int local_36c;
  int *local_368;
  int local_35c;
  undefined1 *local_358;
  int local_34c;
  uint *local_348;
  int local_340;
  int local_33c;
  undefined1 *local_338;
  uint local_330;
  int local_32c;
  MFIter *local_328;
  int local_31c;
  uint *local_318;
  int local_30c;
  undefined1 *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  MFIter *local_2f0;
  int local_2e8;
  int local_2e4;
  MFIter *local_2e0;
  int local_2d4;
  Dim3 local_2d0;
  Dim3 local_2bc;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  Box *local_290;
  double *local_288;
  Dim3 local_280;
  Dim3 local_26c [2];
  Dim3 local_250;
  undefined1 *local_240;
  Dim3 local_230;
  Dim3 local_21c;
  Dim3 local_210;
  Dim3 local_200;
  uint local_1f4;
  IndexType *local_1f0;
  double *local_1e8;
  Dim3 local_1e0;
  IndexType *local_1d0;
  uint local_1c8;
  int iStack_1c4;
  int local_1c0;
  undefined4 local_1bc;
  IndexType *local_1b8;
  undefined4 local_1ac;
  IndexType *local_1a8;
  undefined4 local_19c;
  IndexType *local_198;
  undefined1 *local_180;
  undefined4 local_16c;
  undefined1 *local_168;
  undefined4 local_15c;
  undefined1 *local_158;
  undefined4 local_14c;
  undefined1 *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  Box *local_118;
  undefined4 local_10c;
  Box *local_108;
  undefined4 local_fc;
  Box *local_f8;
  Dim3 local_f0;
  IndexType *local_e0;
  int local_d8;
  int iStack_d4;
  int local_d0;
  undefined4 local_cc;
  int *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  Dim3 local_a0;
  undefined1 *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  flags_ = (uchar)((uint)in_stack_fffffffffffff694 >> 0x18);
  local_3e8 = in_ECX;
  local_3e4 = in_EDX;
  pBVar7 = StateData::getDomain((StateData *)*in_RDI);
  local_428 = (uint)FabArrayBase::ixType
                              ((FabArrayBase *)
                               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  local_3c8 = &local_428;
  local_424._0_8_ = *(undefined8 *)(pBVar7->smallend).vect;
  local_424._8_8_ = *(undefined8 *)((pBVar7->smallend).vect + 2);
  local_424._16_8_ = *(undefined8 *)((pBVar7->bigend).vect + 1);
  local_424._24_4_ = (pBVar7->btype).itype;
  local_3a8 = local_424;
  for (local_3ac = 0; local_3ac < 3; local_3ac = local_3ac + 1) {
    local_348 = &local_39c;
    local_34c = local_3ac;
    local_31c = local_3ac;
    local_2f8 = local_3ac;
    bVar8 = (byte)local_3ac;
    local_3b0 = (uint)((local_428 & 1 << (bVar8 & 0x1f)) != 0);
    local_358 = local_424 + 0x18;
    local_35c = local_3ac;
    local_30c = local_3ac;
    local_2fc = local_3ac;
    local_3b4 = (uint)((local_424._24_4_ & 1 << (bVar8 & 0x1f)) != 0);
    local_3b8 = local_3b0 - local_3b4;
    local_338 = local_424 + 0xc;
    local_33c = local_3ac;
    *(int *)(local_338 + (long)local_3ac * 4) =
         local_3b8 + *(int *)(local_338 + (long)local_3ac * 4);
    in_stack_fffffffffffff6a0 = (MFIter *)(local_424 + 0x18);
    local_32c = local_3ac;
    if (local_3b0 == 0) {
      local_2f4 = local_3ac;
      local_2e8 = local_3ac;
      local_424._24_4_ = (1 << (bVar8 & 0x1f) ^ 0xffffffffU) & local_424._24_4_;
      local_2f0 = in_stack_fffffffffffff6a0;
    }
    else {
      local_2e4 = local_3ac;
      local_2d4 = local_3ac;
      local_424._24_4_ = 1 << (bVar8 & 0x1f) | local_424._24_4_;
      local_2e0 = in_stack_fffffffffffff6a0;
    }
    local_340 = local_3b8;
    local_330 = local_3b0;
    local_328 = in_stack_fffffffffffff6a0;
    local_318 = local_348;
    local_308 = local_358;
  }
  local_408 = (Box *)local_424;
  local_3cc = local_428;
  local_3c0 = pBVar7;
  local_39c = local_428;
  local_430 = Box::loVect(local_408);
  local_438 = Box::hiVect(local_408);
  local_440 = CoordSys::CellSize((CoordSys *)in_RDI[2]);
  local_448 = Geometry::ProbDomain((Geometry *)in_RDI[2]);
  local_449 = StateDescriptor::hasBndryFuncFab((StateDescriptor *)0x13b7c0a);
  bVar3 = StateDescriptor::RunOnGPU((StateDescriptor *)0x13b7c27);
  uVar9 = false;
  if (bVar3) {
    uVar9 = Gpu::inLaunchRegion();
  }
  local_44a = uVar9;
  FArrayBox::FArrayBox((FArrayBox *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
  MFIter::MFIter(in_stack_fffffffffffff6a0,
                 (FabArrayBase *)
                 CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffff69e,
                                         CONCAT15(in_stack_fffffffffffff69d,
                                                  CONCAT14(in_stack_fffffffffffff69c,
                                                           in_stack_fffffffffffff698)))),flags_);
  while (bVar3 = MFIter::isValid(&local_4f8), bVar3) {
    this_00 = &FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)
                          CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                          (MFIter *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668))->
               super_BaseFab<double>;
    local_288 = this_00->dptr;
    local_290 = &this_00->domain;
    local_294 = this_00->nvar;
    local_fc = 0;
    local_128 = (local_290->smallend).vect[0];
    local_10c = 1;
    iStack_124 = (this_00->domain).smallend.vect[1];
    local_2b0.x = (local_290->smallend).vect[0];
    local_2b0.y = (local_290->smallend).vect[1];
    local_11c = 2;
    local_2b0.z = (this_00->domain).smallend.vect[2];
    local_8 = &(this_00->domain).bigend;
    local_c = 0;
    local_38 = local_8->vect[0] + 1;
    local_18 = &(this_00->domain).bigend;
    local_1c = 1;
    iStack_34 = (this_00->domain).bigend.vect[1] + 1;
    local_28 = &(this_00->domain).bigend;
    local_2c = 2;
    local_2d0.z = (this_00->domain).bigend.vect[2] + 1;
    local_2d0.y = iStack_34;
    local_2d0.x = local_38;
    local_388 = this_00;
    local_2bc._0_8_ = local_2d0._0_8_;
    local_2bc.z = local_2d0.z;
    local_2a0._0_8_ = local_2b0._0_8_;
    local_2a0.z = local_2b0.z;
    local_140._0_8_ = local_2b0._0_8_;
    local_140.z = local_2b0.z;
    local_130 = local_290;
    local_120 = local_2b0.z;
    local_118 = local_290;
    local_108 = local_290;
    local_f8 = local_290;
    local_50._0_8_ = local_2d0._0_8_;
    local_50.z = local_2d0.z;
    local_40 = local_290;
    local_30 = local_2d0.z;
    Array4<double>::Array4((Array4<double> *)local_558,local_288,&local_2a0,&local_2bc,local_294);
    local_560 = BaseFab<double>::box(this_00);
    local_561 = 0;
    local_562 = 0;
    for (local_568 = 0; local_568 < 3; local_568 = local_568 + 1) {
      iVar4 = Box::smallEnd(local_560,local_568);
      in_stack_fffffffffffff69e = true;
      if (local_430[local_568] <= iVar4) {
        iVar4 = Box::bigEnd(local_560,local_568);
        in_stack_fffffffffffff69e = local_438[local_568] < iVar4;
      }
      local_569 = in_stack_fffffffffffff69e;
      bVar3 = Geometry::isPeriodic((Geometry *)in_RDI[2],local_568);
      if (bVar3) {
        in_stack_fffffffffffff69d = 1;
        if ((local_562 & 1) == 0) {
          in_stack_fffffffffffff69d = local_569;
        }
        local_562 = in_stack_fffffffffffff69d & 1;
      }
      else {
        in_stack_fffffffffffff69c = 1;
        if ((local_561 & 1) == 0) {
          in_stack_fffffffffffff69c = local_569;
        }
        local_561 = in_stack_fffffffffffff69c & 1;
      }
    }
    if ((local_561 & 1) != 0) {
      in_stack_fffffffffffff668 = local_3e8;
      if ((local_449 & 1) == 0) {
        StateData::FillBoundary
                  (in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                   in_stack_fffffffffffff858,in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
                   in_stack_fffffffffffff848,(int)in_stack_fffffffffffffa40);
      }
      else {
        StateData::FillBoundary
                  (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                   in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                   in_stack_fffffffffffff7d0,SUB84(_local_5a4,4));
      }
      if ((local_562 & 1) != 0) {
        local_588.smallend.vect._0_8_ = *(undefined8 *)(local_408->smallend).vect;
        local_588._8_8_ = *(undefined8 *)((local_408->smallend).vect + 2);
        local_588.bigend.vect._4_8_ = *(undefined8 *)((local_408->bigend).vect + 1);
        local_588.btype.itype = (local_408->btype).itype;
        for (local_58c = 0; local_58c < 3; local_58c = local_58c + 1) {
          bVar3 = Geometry::isPeriodic((Geometry *)in_RDI[2],local_58c);
          if (!bVar3) {
            in_stack_fffffffffffff698 = local_430[local_58c];
            iVar5 = Box::smallEnd(local_560,local_58c);
            iVar5 = in_stack_fffffffffffff698 - iVar5;
            iVar6 = Box::bigEnd(local_560,local_58c);
            iVar4 = local_438[local_58c];
            if (0 < iVar5) {
              Box::growLo(&local_588,local_58c,iVar5);
            }
            if (0 < iVar6 - iVar4) {
              Box::growHi(&local_588,local_58c,iVar6 - iVar4);
            }
          }
        }
        for (local_598 = 0; local_598 < 3; local_598 = local_598 + 1) {
          bVar3 = Geometry::isPeriodic((Geometry *)in_RDI[2],local_598);
          if (bVar3) {
            local_5b4._0_8_ = *(undefined8 *)(local_560->smallend).vect;
            local_5b4._8_8_ = *(undefined8 *)((local_560->smallend).vect + 2);
            _local_5a4 = *(undefined8 *)((local_560->bigend).vect + 1);
            uVar1 = (local_560->btype).itype;
            local_5d0._0_8_ = *(undefined8 *)(local_560->smallend).vect;
            local_5d0._8_8_ = *(undefined8 *)((local_560->smallend).vect + 2);
            in_stack_fffffffffffffa40 = *(undefined8 *)((local_560->bigend).vect + 1);
            uVar2 = (local_560->btype).itype;
            iVar4 = Geometry::period((Geometry *)
                                     CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                                     in_stack_fffffffffffff66c);
            Box::shift((Box *)local_5b4,local_598,iVar4);
            iVar4 = local_598;
            iVar5 = Geometry::period((Geometry *)
                                     CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                                     in_stack_fffffffffffff66c);
            Box::shift((Box *)local_5d0,iVar4,-iVar5);
            Box::operator&=((Box *)local_5b4,&local_588);
            Box::operator&=((Box *)local_5d0,&local_588);
            bVar3 = Box::ok((Box *)local_5b4);
            if (bVar3) {
              if ((local_44a & 1) == 0) {
                FArrayBox::resize((FArrayBox *)
                                  CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                                  in_stack_fffffffffffff678,in_stack_fffffffffffff674,
                                  (Arena *)CONCAT44(in_stack_fffffffffffff66c,
                                                    in_stack_fffffffffffff668));
                in_stack_fffffffffffff684 = local_598;
                local_370 = Geometry::period((Geometry *)
                                             CONCAT44(in_stack_fffffffffffff674,
                                                      in_stack_fffffffffffff670),
                                             in_stack_fffffffffffff66c);
                local_784.bigend.vect._4_8_ = _local_5a4;
                local_370 = -local_370;
                local_368 = local_5b4;
                local_784.smallend.vect[0] = local_5b4[0];
                local_784.smallend.vect[1] = local_5b4[1];
                local_784.smallend.vect[2] = local_5b4[2];
                local_784.bigend.vect[0] = local_5b4[3];
                local_784.btype.itype = uVar1;
                _local_5a4 = local_784.bigend.vect._4_8_;
                local_36c = in_stack_fffffffffffff684;
                Box::shift(&local_784,in_stack_fffffffffffff684,local_370);
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           in_stack_fffffffffffff818,in_stack_fffffffffffff814,
                           (Box *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                           in_stack_fffffffffffff804,in_stack_fffffffffffffad0);
                if ((local_449 & 1) == 0) {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                             in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                             in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
                             in_stack_fffffffffffff848,(int)in_stack_fffffffffffffa40);
                }
                else {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                             in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                             in_stack_fffffffffffff7d0,SUB84(_local_5a4,4));
                }
                in_stack_fffffffffffff668 = local_3e8;
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           in_stack_fffffffffffff818,in_stack_fffffffffffff814,
                           (Box *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                           in_stack_fffffffffffff804,in_stack_fffffffffffffad0);
              }
              else {
                FArrayBox::resize((FArrayBox *)
                                  CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                                  in_stack_fffffffffffff678,in_stack_fffffffffffff674,
                                  (Arena *)CONCAT44(in_stack_fffffffffffff66c,
                                                    in_stack_fffffffffffff668));
                BaseFab<double>::elixir<double,_0>
                          ((BaseFab<double> *)
                           CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffff69e,
                                                   CONCAT15(in_stack_fffffffffffff69d,
                                                            CONCAT14(in_stack_fffffffffffff69c,
                                                                     in_stack_fffffffffffff698)))));
                local_240 = auStack_480;
                local_14c = 0;
                local_15c = 1;
                local_16c = 2;
                local_58 = &iStack_474;
                local_5c = 0;
                local_88 = iStack_474 + 1;
                local_68 = &iStack_474;
                local_6c = 1;
                iStack_84 = local_470 + 1;
                local_78 = &iStack_474;
                local_7c = 2;
                local_280.z = iStack_46c + 1;
                local_280.y = iStack_84;
                local_280.x = local_88;
                local_390 = local_498;
                local_26c[0]._0_8_ = local_280._0_8_;
                local_26c[0].z = local_280.z;
                local_180 = local_240;
                local_168 = local_240;
                local_158 = local_240;
                local_148 = local_240;
                local_a0._0_8_ = local_280._0_8_;
                local_a0.z = local_280.z;
                local_90 = local_240;
                local_80 = local_280.z;
                Array4<double>::Array4
                          (&local_630,(double *)local_498._16_8_,&local_250,local_26c,local_464);
                local_5f0 = &local_630;
                local_6cc = Geometry::period((Geometry *)
                                             CONCAT44(in_stack_fffffffffffff674,
                                                      in_stack_fffffffffffff670),
                                             in_stack_fffffffffffff66c);
                local_6cc = -local_6cc;
                local_6d0 = local_598;
                local_6c8 = local_3e8;
                local_634 = local_6cc;
                memcpy(auStack_6c0,local_5f0,0x3c);
                memcpy(auStack_680,local_558,0x3c);
                local_640 = local_3e4;
                amrex::operator()((Box *)CONCAT44(in_stack_fffffffffffff674,
                                                  in_stack_fffffffffffff670),
                                  (anon_class_152_6_5db014db *)
                                  CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                                  0x13b8782);
                in_stack_fffffffffffff668 = local_3e8;
                if ((local_449 & 1) == 0) {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                             in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                             in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
                             in_stack_fffffffffffff848,(int)in_stack_fffffffffffffa40);
                }
                else {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                             in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                             in_stack_fffffffffffff7d0,SUB84(_local_5a4,4));
                }
                local_768 = local_598;
                local_764 = local_634;
                local_760 = local_3e8;
                memcpy(auStack_758,local_558,0x3c);
                local_718 = local_3e4;
                memcpy(auStack_710,local_5f0,0x3c);
                amrex::operator()((Box *)CONCAT44(in_stack_fffffffffffff674,
                                                  in_stack_fffffffffffff670),
                                  (anon_class_152_6_452f8925 *)
                                  CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                                  0x13b88c5);
                Gpu::Elixir::~Elixir
                          ((Elixir *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
              }
            }
            bVar3 = Box::ok((Box *)local_5d0);
            if (bVar3) {
              if ((local_44a & 1) == 0) {
                FArrayBox::resize((FArrayBox *)
                                  CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                                  in_stack_fffffffffffff678,in_stack_fffffffffffff674,
                                  (Arena *)CONCAT44(in_stack_fffffffffffff66c,
                                                    in_stack_fffffffffffff668));
                in_stack_fffffffffffff674 = local_598;
                local_380 = Geometry::period((Geometry *)
                                             CONCAT44(local_598,in_stack_fffffffffffff670),
                                             in_stack_fffffffffffff66c);
                local_93c.bigend.vect._4_8_ = in_stack_fffffffffffffa40;
                local_378 = local_5d0;
                local_93c.smallend.vect[0] = local_5d0[0];
                local_93c.smallend.vect[1] = local_5d0[1];
                local_93c.smallend.vect[2] = local_5d0[2];
                local_93c.bigend.vect[0] = local_5d0[3];
                local_93c.btype.itype = uVar2;
                in_stack_fffffffffffffa40 = local_93c.bigend.vect._4_8_;
                local_37c = in_stack_fffffffffffff674;
                Box::shift(&local_93c,in_stack_fffffffffffff674,local_380);
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           in_stack_fffffffffffff818,in_stack_fffffffffffff814,
                           (Box *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                           in_stack_fffffffffffff804,in_stack_fffffffffffffad0);
                if ((local_449 & 1) == 0) {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                             in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                             in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
                             in_stack_fffffffffffff848,(int)in_stack_fffffffffffffa40);
                }
                else {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                             in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                             in_stack_fffffffffffff7d0,SUB84(_local_5a4,4));
                }
                in_stack_fffffffffffff668 = local_3e8;
                BaseFab<double>::copy<(amrex::RunOn)1>
                          (in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                           in_stack_fffffffffffff818,in_stack_fffffffffffff814,
                           (Box *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                           in_stack_fffffffffffff804,in_stack_fffffffffffffad0);
              }
              else {
                FArrayBox::resize((FArrayBox *)
                                  CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                                  in_stack_fffffffffffff678,in_stack_fffffffffffff674,
                                  (Arena *)CONCAT44(in_stack_fffffffffffff66c,
                                                    in_stack_fffffffffffff668));
                in_stack_fffffffffffff678 = (Box *)local_498;
                BaseFab<double>::elixir<double,_0>
                          ((BaseFab<double> *)
                           CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffff69e,
                                                   CONCAT15(in_stack_fffffffffffff69d,
                                                            CONCAT14(in_stack_fffffffffffff69c,
                                                                     in_stack_fffffffffffff698)))));
                local_1e8 = *(double **)((in_stack_fffffffffffff678->bigend).vect + 1);
                local_1f0 = &in_stack_fffffffffffff678->btype;
                local_1f4 = in_stack_fffffffffffff678[1].btype.itype;
                local_19c = 0;
                local_1c8 = local_1f0->itype;
                local_1ac = 1;
                iStack_1c4 = in_stack_fffffffffffff678[1].smallend.vect[0];
                local_210._0_8_ = *(undefined8 *)local_1f0;
                local_1bc = 2;
                local_210.z = in_stack_fffffffffffff678[1].smallend.vect[1];
                local_a8 = in_stack_fffffffffffff678[1].smallend.vect + 2;
                local_ac = 0;
                local_d8 = *local_a8 + 1;
                local_b8 = in_stack_fffffffffffff678[1].smallend.vect + 2;
                local_bc = 1;
                iStack_d4 = in_stack_fffffffffffff678[1].bigend.vect[0] + 1;
                local_c8 = in_stack_fffffffffffff678[1].smallend.vect + 2;
                local_cc = 2;
                local_230.z = in_stack_fffffffffffff678[1].bigend.vect[1] + 1;
                local_230.y = iStack_d4;
                local_230.x = local_d8;
                local_398 = in_stack_fffffffffffff678;
                local_21c._0_8_ = local_230._0_8_;
                local_21c.z = local_230.z;
                local_200._0_8_ = local_210._0_8_;
                local_200.z = local_210.z;
                local_1e0._0_8_ = local_210._0_8_;
                local_1e0.z = local_210.z;
                local_1d0 = local_1f0;
                local_1c0 = local_210.z;
                local_1b8 = local_1f0;
                local_1a8 = local_1f0;
                local_198 = local_1f0;
                local_f0._0_8_ = local_230._0_8_;
                local_f0.z = local_230.z;
                local_e0 = local_1f0;
                local_d0 = local_230.z;
                Array4<double>::Array4
                          ((Array4<double> *)&stack0xfffffffffffff818,local_1e8,&local_200,
                           &local_21c,local_1f4);
                in_stack_fffffffffffff858 = (Real *)&stack0xfffffffffffff818;
                local_884 = Geometry::period((Geometry *)
                                             CONCAT44(in_stack_fffffffffffff674,
                                                      in_stack_fffffffffffff670),
                                             in_stack_fffffffffffff66c);
                local_888 = local_598;
                local_880 = local_3e8;
                iVar4 = local_884;
                memcpy(auStack_878,in_stack_fffffffffffff858,0x3c);
                memcpy(auStack_838,local_558,0x3c);
                in_stack_fffffffffffff808 = local_3e4;
                amrex::operator()((Box *)CONCAT44(in_stack_fffffffffffff674,
                                                  in_stack_fffffffffffff670),
                                  (anon_class_152_6_5db014db *)
                                  CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                                  0x13b8e39);
                in_stack_fffffffffffff668 = local_3e8;
                if ((local_449 & 1) == 0) {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                             in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                             in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
                             in_stack_fffffffffffff848,(int)in_stack_fffffffffffffa40);
                  local_91c = iVar4;
                }
                else {
                  StateData::FillBoundary
                            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                             in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                             in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                             in_stack_fffffffffffff7d0,SUB84(_local_5a4,4));
                  local_91c = iVar4;
                }
                local_920 = local_598;
                local_918 = local_3e8;
                in_stack_fffffffffffff814 = local_91c;
                memcpy(auStack_910,local_558,0x3c);
                local_8d0 = local_3e4;
                memcpy(auStack_8c8,in_stack_fffffffffffff858,0x3c);
                amrex::operator()((Box *)CONCAT44(in_stack_fffffffffffff674,
                                                  in_stack_fffffffffffff670),
                                  (anon_class_152_6_452f8925 *)
                                  CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                                  0x13b8f6d);
                Gpu::Elixir::~Elixir
                          ((Elixir *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
              }
            }
          }
        }
      }
    }
    MFIter::operator++(&local_4f8);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670));
  FArrayBox::~FArrayBox((FArrayBox *)0x13b916e);
  return;
}

Assistant:

void
StateDataPhysBCFunct::operator() (MultiFab& mf, int dest_comp, int num_comp, IntVect const& /* */,
                                  Real time, int /*bccomp*/)
{
    BL_PROFILE("StateDataPhysBCFunct::()");

    // Match domain box type to MF index type.
    const Box&     domain_mt   = amrex::convert(statedata->getDomain(),mf.ixType());
    const int*     domainlo    = domain_mt.loVect();
    const int*     domainhi    = domain_mt.hiVect();
    const Real*    dx          = geom.CellSize();
    const RealBox& prob_domain = geom.ProbDomain();

    bool has_bndryfunc_fab = statedata->desc->hasBndryFuncFab();
    bool run_on_gpu = statedata->desc->RunOnGPU() && Gpu::inLaunchRegion();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        FArrayBox tmp;

        for (MFIter mfi(mf); mfi.isValid(); ++mfi)
        {
            FArrayBox& dest = mf[mfi];
            Array4<Real> const& desta = dest.array();
            const Box& bx = dest.box();

            bool has_phys_bc = false;
            bool is_periodic = false;
            for (int i = 0; i < AMREX_SPACEDIM; ++i) {
                bool touch = bx.smallEnd(i) < domainlo[i] || bx.bigEnd(i) > domainhi[i];
                if (geom.isPeriodic(i)) {
                    is_periodic = is_periodic || touch;
                } else {
                    has_phys_bc = has_phys_bc || touch;
                }
            }

            if (has_phys_bc)
            {
                if (has_bndryfunc_fab) {
                    statedata->FillBoundary(bx, dest, time, geom, dest_comp, src_comp, num_comp);
                } else {
                    statedata->FillBoundary(dest, time, dx, prob_domain, dest_comp, src_comp, num_comp);
                }

                if (is_periodic) // fix up corner
                {
                    Box GrownDomain = domain_mt;

                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                    {
                        if (!geom.isPeriodic(dir))
                        {
                            const int lo = domainlo[dir] - bx.smallEnd(dir);
                            const int hi = bx.bigEnd(dir) - domainhi[dir];
                            if (lo > 0) GrownDomain.growLo(dir,lo);
                            if (hi > 0) GrownDomain.growHi(dir,hi);
                        }
                    }

                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                    {
                        if (!geom.isPeriodic(dir)) continue;

                        Box lo_slab = bx;
                        Box hi_slab = bx;
                        lo_slab.shift(dir, geom.period(dir));
                        hi_slab.shift(dir,-geom.period(dir));
                        lo_slab &= GrownDomain;
                        hi_slab &= GrownDomain;

                        if (lo_slab.ok())
                        {
                            if (run_on_gpu)
                            {
                                tmp.resize(lo_slab,num_comp);
                                Elixir elitmp = tmp.elixir();
                                Array4<Real> const& tmpa = tmp.array();
                                const int ishift = -geom.period(dir);
                                amrex::launch(lo_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n)
                                                        = desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp);
                                                }
                                            }
                                        }
                                    }
                                });
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(lo_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                amrex::launch(lo_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp)
                                                        = tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n);
                                                }
                                            }
                                        }
                                    }
                                });
                            }
                            else
                            {
                                tmp.resize(lo_slab,num_comp);
                                const Box db = amrex::shift(lo_slab, dir, -geom.period(dir));
                                tmp.copy<RunOn::Host>(dest, db, dest_comp, lo_slab, 0, num_comp);
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(lo_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                dest.copy<RunOn::Host>(tmp, lo_slab, 0, db, dest_comp, num_comp);
                            }
                        }

                        if (hi_slab.ok())
                        {
                            if (run_on_gpu)
                            {
                                tmp.resize(hi_slab,num_comp);
                                Elixir elitmp = tmp.elixir();
                                Array4<Real> const& tmpa = tmp.array();
                                const int ishift = geom.period(dir);
                                amrex::launch(hi_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n)
                                                        = desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp);
                                                }
                                            }
                                        }
                                    }
                                });
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(hi_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                amrex::launch(hi_slab,
                                [=] AMREX_GPU_DEVICE (Box const& tbx) noexcept
                                {
                                    const Box db = amrex::shift(tbx, dir, ishift);
                                    const auto dlo = amrex::lbound(db);
                                    const auto tlo = amrex::lbound(tbx);
                                    const auto len = amrex::length(db);
                                    for (int n = 0; n < num_comp; ++n) {
                                        for         (int k = 0; k < len.z; ++k) {
                                            for     (int j = 0; j < len.y; ++j) {
                                                AMREX_PRAGMA_SIMD
                                                for (int i = 0; i < len.x; ++i) {
                                                    desta(i+dlo.x,j+dlo.y,k+dlo.z,n+dest_comp)
                                                        = tmpa(i+tlo.x,j+tlo.y,k+tlo.z,n);
                                                }
                                            }
                                        }
                                    }
                                });
                            }
                            else
                            {
                                tmp.resize(hi_slab,num_comp);
                                const Box db = amrex::shift(hi_slab, dir, geom.period(dir));
                                tmp.copy<RunOn::Host>(dest, db, dest_comp, hi_slab, 0, num_comp);
                                if (has_bndryfunc_fab) {
                                    statedata->FillBoundary(hi_slab, tmp, time, geom, 0, src_comp, num_comp);
                                } else {
                                    statedata->FillBoundary(tmp, time, dx, prob_domain, 0, src_comp, num_comp);
                                }
                                dest.copy<RunOn::Host>(tmp, hi_slab, 0, db, dest_comp, num_comp);
                            }
                        }
                    }
                }
            }
        }
    }
}